

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

void Ssw_MatchingStart(Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairs)

{
  uint __line;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  char *__assertion;
  
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  for (iVar6 = 0; iVar6 < vPairs->nSize; iVar6 = iVar6 + 2) {
    iVar1 = Vec_IntEntry(vPairs,iVar6);
    pAVar2 = Aig_ManObj(p0,iVar1);
    iVar1 = Vec_IntEntry(vPairs,iVar6 + 1);
    pAVar3 = Aig_ManObj(p1,iVar1);
    if ((pAVar2->field_5).pData != (void *)0x0) {
      __assertion = "pObj0->pData == NULL";
      __line = 0x4b;
      goto LAB_004e87d0;
    }
    if ((pAVar3->field_5).pData != (void *)0x0) {
      __assertion = "pObj1->pData == NULL";
      __line = 0x4c;
      goto LAB_004e87d0;
    }
    (pAVar2->field_5).pData = pAVar3;
    (pAVar3->field_5).pData = pAVar2;
  }
  if ((Aig_Obj_t *)(p0->pConst1->field_5).pData == p1->pConst1) {
    if ((Aig_Obj_t *)(p1->pConst1->field_5).pData == p0->pConst1) {
      iVar6 = 0;
      do {
        if (p0->nTruePis <= iVar6) {
          iVar6 = 0;
          goto LAB_004e8697;
        }
        pvVar4 = Vec_PtrEntry(p0->vCis,iVar6);
        pvVar5 = Vec_PtrEntry(p1->vCis,iVar6);
        if (*(void **)((long)pvVar4 + 0x28) != pvVar5) {
          __assertion = "pObj0->pData == pObj1";
          __line = 0x59;
          goto LAB_004e87d0;
        }
        iVar6 = iVar6 + 1;
      } while (*(void **)((long)pvVar5 + 0x28) == pvVar4);
      __assertion = "pObj1->pData == pObj0";
      __line = 0x5a;
    }
    else {
      __assertion = "pObj1->pData == pObj0";
      __line = 0x54;
    }
  }
  else {
    __assertion = "pObj0->pData == pObj1";
    __line = 0x53;
  }
  goto LAB_004e87d0;
  while (iVar6 = iVar6 + 1, *(long *)((long)pvVar5 + 0x28) == 0) {
LAB_004e8697:
    if (p0->vCos->nSize <= iVar6) {
      for (iVar6 = 0; iVar6 < p0->nRegs; iVar6 = iVar6 + 1) {
        pvVar4 = Vec_PtrEntry(p0->vCis,p0->nTruePis + iVar6);
        if (*(Aig_Obj_t **)((long)pvVar4 + 0x28) != (Aig_Obj_t *)0x0) {
          pAVar7 = p1;
          iVar1 = Saig_ObjIsLo(p1,*(Aig_Obj_t **)((long)pvVar4 + 0x28));
          if (iVar1 == 0) {
            Abc_Print((int)pAVar7,"Mismatch between LO pairs.\n");
          }
        }
      }
      for (iVar6 = 0; iVar6 < p1->nRegs; iVar6 = iVar6 + 1) {
        pvVar4 = Vec_PtrEntry(p1->vCis,p1->nTruePis + iVar6);
        if (*(Aig_Obj_t **)((long)pvVar4 + 0x28) != (Aig_Obj_t *)0x0) {
          pAVar7 = p0;
          iVar1 = Saig_ObjIsLo(p0,*(Aig_Obj_t **)((long)pvVar4 + 0x28));
          if (iVar1 == 0) {
            Abc_Print((int)pAVar7,"Mismatch between LO pairs.\n");
          }
        }
      }
      return;
    }
    pvVar4 = Vec_PtrEntry(p0->vCos,iVar6);
    pvVar5 = Vec_PtrEntry(p1->vCos,iVar6);
    if (*(long *)((long)pvVar4 + 0x28) != 0) {
      __assertion = "pObj0->pData == NULL";
      __line = 0x60;
      goto LAB_004e87d0;
    }
  }
  __assertion = "pObj1->pData == NULL";
  __line = 0x61;
LAB_004e87d0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                ,__line,"void Ssw_MatchingStart(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

void Ssw_MatchingStart( Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairs )
{
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairs, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairs, i+1) );
        assert( pObj0->pData == NULL );
        assert( pObj1->pData == NULL );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // make sure constants are matched
    pObj0 = Aig_ManConst1( p0 );
    pObj1 = Aig_ManConst1( p1 );
    assert( pObj0->pData == pObj1 );
    assert( pObj1->pData == pObj0 );
    // make sure PIs are matched
    Saig_ManForEachPi( p0, pObj0, i )
    {
        pObj1 = Aig_ManCi( p1, i );
        assert( pObj0->pData == pObj1 );
        assert( pObj1->pData == pObj0 );
    }
    // make sure the POs are not matched
    Aig_ManForEachCo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        assert( pObj0->pData == NULL );
        assert( pObj1->pData == NULL );
    }

    // check that LIs/LOs are matched in sync
    Saig_ManForEachLo( p0, pObj0, i )
    {
        if ( pObj0->pData == NULL )
            continue;
        pObj1 = (Aig_Obj_t *)pObj0->pData;
        if ( !Saig_ObjIsLo(p1, pObj1) )
            Abc_Print( 1, "Mismatch between LO pairs.\n" );
    }
    Saig_ManForEachLo( p1, pObj1, i )
    {
        if ( pObj1->pData == NULL )
            continue;
        pObj0 = (Aig_Obj_t *)pObj1->pData;
        if ( !Saig_ObjIsLo(p0, pObj0) )
            Abc_Print( 1, "Mismatch between LO pairs.\n" );
    }
}